

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::render
               (TestContext *testContext,RenderContext *renderContext,
               TextureRenderer *textureRenderer,ResultCollector *results,Random *rng,deUint32 name,
               vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
               *data,ImageInfo *info,Verify verify)

{
  pointer *ppAVar1;
  deUint32 dVar2;
  pointer log;
  pointer pCVar3;
  ConstPixelBufferAccess *pCVar4;
  bool bVar5;
  bool bVar6;
  CompressedTexFormat format_00;
  int iVar7;
  ContextType ctxType;
  TextureChannelClass TVar8;
  GLenum GVar9;
  int iVar10;
  CubeFace CVar11;
  Functions *gl;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  *pvVar16;
  int level;
  UniquePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> ctxInfo;
  TexDecompressionParams decompressParams;
  ConstPixelBufferAccess *levels [6];
  Texture2DView refTexture;
  TextureFormat readPixelsFormat;
  TextureFormat format;
  TextureFormat local_2b8 [2];
  IVec3 size;
  Vector<int,_4> local_298;
  IVec3 texelBlockPixelSize;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> levelAccesses;
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  levelDatas;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_1d0;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_1b8;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_1a0;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_188;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_170 [11];
  Vec4 threshold;
  Vector<int,_4> local_50;
  Vector<int,_4> local_40;
  undefined4 extraout_var;
  
  dVar2 = info->m_target;
  if (dVar2 != 0x8d41) {
    if (dVar2 == 0x806f) {
      bVar5 = glu::isCompressedFormat(info->m_format);
      if (!bVar5) {
        getLevelAccesses((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          *)&levelDatas,data,info);
        tcu::Texture3DView::Texture3DView
                  ((Texture3DView *)&levelAccesses,
                   (int)(((long)levelDatas.
                                super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)levelDatas.
                               super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x28),
                   (ConstPixelBufferAccess *)
                   levelDatas.
                   super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        renderTexture3DView(testContext,renderContext,textureRenderer,results,rng,name,info,
                            (Texture3DView *)&levelAccesses,verify);
        goto LAB_005acd97;
      }
      levelDatas.
      super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      levelDatas.
      super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      levelDatas.
      super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      levelAccesses.
      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      levelAccesses.
      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      levelAccesses.
      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      decompressTexture(&levelDatas,&levelAccesses,renderContext,info,data);
      tcu::Texture3DView::Texture3DView
                ((Texture3DView *)&refTexture,
                 (int)(((long)levelAccesses.
                              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)levelAccesses.
                             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x28),
                 &(levelAccesses.
                   super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                   ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess);
      renderTexture3DView(testContext,renderContext,textureRenderer,results,rng,name,info,
                          (Texture3DView *)&refTexture,verify);
    }
    else {
      if (dVar2 == 0x8513) {
        bVar5 = glu::isCompressedFormat(info->m_format);
        if (bVar5) {
          format_00 = glu::mapGLCompressedTexFormat(info->m_format);
          local_298.m_data[0] = format_00;
          local_2b8[0] = tcu::getUncompressedFormat(format_00);
          iVar7 = getTexelBlockSize(info->m_format);
          getTexelBlockPixelSize((anon_unknown_0 *)&texelBlockPixelSize,info->m_format);
          ctxType.super_ApiType.m_bits =
               (ApiType)(*renderContext->_vptr_RenderContext[2])(renderContext);
          bVar5 = glu::contextSupports(ctxType,(ApiType)0x23);
          memset(&levelDatas,0,0x90);
          memset(&levelAccesses,0,0x90);
          ctxInfo.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.m_data.
          ptr = glu::ContextInfo::create(renderContext);
          decompressParams.astcMode = ASTCMODE_LAST;
          bVar6 = tcu::isAstcFormat(format_00);
          if (bVar6) {
            bVar6 = glu::ContextInfo::isExtensionSupported
                              (ctxInfo.
                               super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>
                               .m_data.ptr,"GL_KHR_texture_compression_astc_hdr");
            if ((!bVar6) || (bVar6 = tcu::isAstcSRGBFormat(format_00), bVar6)) {
              if ((bVar5) ||
                 (bVar5 = glu::ContextInfo::isExtensionSupported
                                    (ctxInfo.
                                     super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>
                                     .m_data.ptr,"GL_KHR_texture_compression_astc_ldr"), bVar5)) {
                decompressParams.astcMode = ASTCMODE_LDR;
              }
            }
            else {
              decompressParams.astcMode = ASTCMODE_HDR;
            }
          }
          for (lVar14 = 0; lVar14 != 0x90; lVar14 = lVar14 + 0x18) {
            iVar10 = getLevelCount(info);
            std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::resize
                      ((vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *)
                       ((long)&levelDatas.
                               super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar14),(long)iVar10);
            iVar10 = getLevelCount(info);
            std::
            vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
            ::resize((vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                      *)((long)&levelAccesses.
                                super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar14),(long)iVar10);
          }
          for (lVar14 = 0; iVar10 = getLevelCount(info), lVar14 < iVar10; lVar14 = lVar14 + 1) {
            iVar10 = 0;
            for (lVar15 = 0; lVar15 != 0x90; lVar15 = lVar15 + 0x18) {
              getLevelSize((anon_unknown_0 *)&refTexture,info->m_target,&info->m_size,(int)lVar14);
              divRoundUp((anon_unknown_0 *)levels,(IVec3 *)&refTexture,&texelBlockPixelSize);
              decompressTextureLevel
                        (&decompressParams,
                         (ArrayBuffer<unsigned_char,_1UL,_1UL> *)
                         (*(long *)((long)&levelAccesses.
                                           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar15) +
                         lVar14 * 0x10),
                         (PixelBufferAccess *)
                         (*(long *)((long)&levelDatas.
                                           super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar15) +
                         lVar14 * 0x28),(CompressedTexFormat *)&local_298,local_2b8,
                         (IVec3 *)&refTexture,
                         (void *)((long)((int)levels[0] * iVar10 * levels[0]._4_4_ * (int)levels[1])
                                 + (long)(data->
                                         super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start[lVar14].m_ptr));
              iVar10 = iVar10 + iVar7;
            }
          }
          pvVar16 = &levelDatas;
          for (lVar14 = 0; lVar14 != 0x18; lVar14 = lVar14 + 4) {
            pCVar4 = (ConstPixelBufferAccess *)
                     (pvVar16->
                     super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            CVar11 = glu::getCubeFaceFromGL(*(deUint32 *)((long)&DAT_0085b360 + lVar14));
            levels[CVar11] = pCVar4;
            pvVar16 = pvVar16 + 1;
          }
          iVar7 = getLevelCount(info);
          tcu::TextureCubeView::TextureCubeView((TextureCubeView *)&refTexture,iVar7,&levels);
          renderTextureCubemapView
                    (testContext,renderContext,textureRenderer,results,rng,name,info,
                     (TextureCubeView *)&refTexture,verify);
          de::details::UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>::
          ~UniqueBase(&ctxInfo.
                       super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>);
          lVar14 = 0x78;
          do {
            std::
            vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
            ::~vector((vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                       *)((long)&levelAccesses.
                                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar14));
            lVar14 = lVar14 + -0x18;
          } while (lVar14 != -0x18);
          lVar14 = 0x78;
          do {
            std::_Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::
            ~_Vector_base((_Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                           *)((long)&levelDatas.
                                     super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar14));
            lVar14 = lVar14 + -0x18;
          } while (lVar14 != -0x18);
          return;
        }
        pvVar16 = &levelDatas;
        getCubeLevelAccesses
                  ((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                    *)pvVar16,data,info,0);
        getCubeLevelAccesses(&local_1d0,data,info,1);
        getCubeLevelAccesses(&local_1b8,data,info,2);
        getCubeLevelAccesses(&local_1a0,data,info,3);
        getCubeLevelAccesses(&local_188,data,info,4);
        getCubeLevelAccesses(local_170,data,info,5);
        for (lVar14 = 0; lVar14 != 0x18; lVar14 = lVar14 + 4) {
          pCVar3 = (((_Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                      *)&pvVar16->
                         super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                    )->_M_impl).super__Vector_impl_data._M_start;
          CVar11 = glu::getCubeFaceFromGL(*(deUint32 *)((long)&DAT_0085b360 + lVar14));
          *(pointer *)(&refTexture.m_numLevels + (ulong)CVar11 * 2) = pCVar3;
          pvVar16 = pvVar16 + 1;
        }
        iVar7 = getLevelCount(info);
        tcu::TextureCubeView::TextureCubeView
                  ((TextureCubeView *)&levelAccesses,iVar7,
                   (ConstPixelBufferAccess *(*) [6])&refTexture);
        renderTextureCubemapView
                  (testContext,renderContext,textureRenderer,results,rng,name,info,
                   (TextureCubeView *)&levelAccesses,verify);
        lVar14 = 0x78;
        do {
          std::
          _Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
          ~_Vector_base((_Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                         *)((long)&levelDatas.
                                   super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar14));
          lVar14 = lVar14 + -0x18;
        } while (lVar14 != -0x18);
        return;
      }
      if (dVar2 == 0x8c1a) {
        bVar5 = glu::isCompressedFormat(info->m_format);
        if (!bVar5) {
          getLevelAccesses((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                            *)&levelDatas,data,info);
          tcu::Texture2DArrayView::Texture2DArrayView
                    ((Texture2DArrayView *)&levelAccesses,
                     (int)(((long)levelDatas.
                                  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)levelDatas.
                                 super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x28),
                     (ConstPixelBufferAccess *)
                     levelDatas.
                     super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
          renderTexture2DArrayView
                    (testContext,renderContext,textureRenderer,results,rng,name,info,
                     (Texture2DArrayView *)&levelAccesses,verify);
          goto LAB_005acd97;
        }
        levelDatas.
        super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        levelDatas.
        super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        levelDatas.
        super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        levelAccesses.
        super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        levelAccesses.
        super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        levelAccesses.
        super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        decompressTexture(&levelDatas,&levelAccesses,renderContext,info,data);
        tcu::Texture2DArrayView::Texture2DArrayView
                  ((Texture2DArrayView *)&refTexture,
                   (int)(((long)levelAccesses.
                                super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)levelAccesses.
                               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x28),
                   &(levelAccesses.
                     super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                     ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess);
        renderTexture2DArrayView
                  (testContext,renderContext,textureRenderer,results,rng,name,info,
                   (Texture2DArrayView *)&refTexture,verify);
      }
      else {
        if (dVar2 != 0xde1) {
          return;
        }
        bVar5 = glu::isCompressedFormat(info->m_format);
        if (!bVar5) {
          getLevelAccesses((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                            *)&levelDatas,data,info);
          levelAccesses.
          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(levelAccesses.
                                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                 (int)(((long)levelDatas.
                                              super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)levelDatas.
                                             super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start) / 0x28));
          levelAccesses.
          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               (pointer)levelDatas.
                        super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          renderTexture2DView(testContext,renderContext,textureRenderer,results,rng,name,info,
                              (Texture2DView *)&levelAccesses,verify);
LAB_005acd97:
          std::
          _Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
          ~_Vector_base((_Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                         *)&levelDatas);
          return;
        }
        levelDatas.
        super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        levelDatas.
        super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        levelDatas.
        super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        levelAccesses.
        super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        levelAccesses.
        super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        levelAccesses.
        super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        decompressTexture(&levelDatas,&levelAccesses,renderContext,info,data);
        refTexture.m_numLevels =
             (int)(((long)levelAccesses.
                          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)levelAccesses.
                         super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x28);
        refTexture.m_levels =
             &(levelAccesses.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess;
        renderTexture2DView(testContext,renderContext,textureRenderer,results,rng,name,info,
                            &refTexture,verify);
      }
    }
    std::_Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::
    ~_Vector_base(&levelAccesses.
                   super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                 );
    std::
    vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
    ::~vector(&levelDatas);
    return;
  }
  iVar7 = (*renderContext->_vptr_RenderContext[3])(renderContext);
  gl = (Functions *)CONCAT44(extraout_var,iVar7);
  log = (pointer)testContext->m_log;
  format = glu::mapGLInternalFormat(info->m_format);
  tcu::Vector<int,_3>::Vector(&size,&info->m_size);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)&levelAccesses,&format,size.m_data[0],size.m_data[1],1,
             ((data->
              super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
              )._M_impl.super__Vector_impl_data._M_start)->m_ptr);
  TVar8 = tcu::getTextureChannelClass(format.type);
  if (TVar8 < TEXTURECHANNELCLASS_LAST) {
    uVar12 = *(ulong *)(&DAT_0085b3f0 + (ulong)TVar8 * 8);
    uVar13 = 8;
  }
  else {
    uVar13 = 0x15;
    uVar12 = 0x2600000000;
  }
  readPixelsFormat = (TextureFormat)(uVar12 | uVar13);
  tcu::TextureLevel::TextureLevel
            ((TextureLevel *)&refTexture,&readPixelsFormat,size.m_data[0],size.m_data[1],1);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)3> *)levels,gl);
  (*gl->bindFramebuffer)(0x8d40,(GLuint)levels[2]);
  GVar9 = (*gl->getError)();
  glu::checkError(GVar9,"Failed to create and bind framebuffer.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                  ,0x695);
  (*gl->bindRenderbuffer)(0x8d41,name);
  (*gl->framebufferRenderbuffer)(0x8d40,0x8ce0,0x8d41,name);
  GVar9 = (*gl->getError)();
  glu::checkError(GVar9,"Failed to bind and attach renderbuffer to framebuffer.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                  ,0x699);
  if (verify != VERIFY_NONE) {
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&levelDatas,(TextureLevel *)&refTexture);
    glu::readPixels(renderContext,0,0,(PixelBufferAccess *)&levelDatas);
  }
  (*gl->bindRenderbuffer)(0x8d41,0);
  (*gl->bindFramebuffer)(0x8d40,0);
  GVar9 = (*gl->getError)();
  glu::checkError(GVar9,"Failed to unbind renderbuffer and framebuffer.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                  ,0x6a0);
  glu::ObjectWrapper::~ObjectWrapper((ObjectWrapper *)levels);
  if (verify != VERIFY_COMPARE_REFERENCE) goto LAB_005ad4d6;
  bVar5 = isFloatFormat(info->m_format);
  if (bVar5) {
    levels[0] = (ConstPixelBufferAccess *)0x200000002;
    levels[1] = (ConstPixelBufferAccess *)0x200000002;
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&levelDatas,(TextureLevel *)&refTexture);
    bVar5 = tcu::floatUlpThresholdCompare
                      ((TestLog *)log,"Image comparison","Image comparison",
                       (ConstPixelBufferAccess *)&levelAccesses,
                       (ConstPixelBufferAccess *)&levelDatas,(UVec4 *)levels,COMPARE_LOG_ON_ERROR);
    if (!bVar5) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&levelDatas,"Image comparison failed.",(allocator<char> *)&ctxInfo);
      tcu::ResultCollector::fail(results,(string *)&levelDatas);
      goto LAB_005ad4c9;
    }
    ppAVar1 = &levelDatas.
               super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    levelDatas.
    super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
    ._M_impl.super__Vector_impl_data._M_start = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)ppAVar1);
    std::operator<<((ostream *)ppAVar1,"Image comarison passed.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&levelDatas,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    bVar5 = isIntFormat(info->m_format);
    if ((bVar5) || (bVar5 = isUintFormat(info->m_format), bVar5)) {
      levels[0] = (ConstPixelBufferAccess *)0x100000001;
      levels[1] = (ConstPixelBufferAccess *)0x100000001;
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&levelDatas,(TextureLevel *)&refTexture);
      bVar5 = tcu::intThresholdCompare
                        ((TestLog *)log,"Image comparison","Image comparison",
                         (ConstPixelBufferAccess *)&levelAccesses,
                         (ConstPixelBufferAccess *)&levelDatas,(UVec4 *)levels,COMPARE_LOG_ON_ERROR)
      ;
      if (!bVar5) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&levelDatas,"Image comparison failed.",(allocator<char> *)&ctxInfo);
        tcu::ResultCollector::fail(results,(string *)&levelDatas);
        goto LAB_005ad4c9;
      }
      ppAVar1 = &levelDatas.
                 super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      levelDatas.
      super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppAVar1);
      std::operator<<((ostream *)ppAVar1,"Image comarison passed.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&levelDatas,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      tcu::getTextureFormatBitDepth((tcu *)&levelDatas,&format);
      tcu::getTextureFormatBitDepth((tcu *)levels,&readPixelsFormat);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&ctxInfo,1.0);
      tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&decompressParams,1);
      tcu::min<int,4>((tcu *)&local_50,(Vector<int,_4> *)&levelDatas,(Vector<int,_4> *)levels);
      tcu::operator<<((tcu *)&local_298,(Vector<int,_4> *)&decompressParams,&local_50);
      tcu::Vector<int,_4>::Vector(&local_40,1);
      tcu::operator-((tcu *)local_2b8,&local_298,&local_40);
      tcu::Vector<int,_4>::cast<float>((Vector<int,_4> *)&texelBlockPixelSize);
      tcu::operator/((tcu *)&threshold,(Vector<float,_4> *)&ctxInfo,
                     (Vector<float,_4> *)&texelBlockPixelSize);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&levelDatas,(TextureLevel *)&refTexture);
      bVar5 = tcu::floatThresholdCompare
                        ((TestLog *)log,"Image comparison","Image comparison",
                         (ConstPixelBufferAccess *)&levelAccesses,
                         (ConstPixelBufferAccess *)&levelDatas,&threshold,COMPARE_LOG_ON_ERROR);
      if (!bVar5) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&levelDatas,"Image comparison failed.",(allocator<char> *)levels);
        tcu::ResultCollector::fail(results,(string *)&levelDatas);
LAB_005ad4c9:
        std::__cxx11::string::~string((string *)&levelDatas);
        goto LAB_005ad4d6;
      }
      ppAVar1 = &levelDatas.
                 super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      levelDatas.
      super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppAVar1);
      std::operator<<((ostream *)ppAVar1,"Image comarison passed.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&levelDatas,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
  }
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)
             &levelDatas.
              super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
LAB_005ad4d6:
  tcu::TextureLevel::~TextureLevel((TextureLevel *)&refTexture);
  return;
}

Assistant:

void render (tcu::TestContext&						testContext,
			 glu::RenderContext&					renderContext,
			 TextureRenderer&						textureRenderer,
			 tcu::ResultCollector&					results,
			 de::Random&							rng,
			 deUint32								name,
			 const vector<ArrayBuffer<deUint8> >&	data,
			 const ImageInfo&						info,
			 Verify									verify)
{
	switch (info.getTarget())
	{
		case GL_TEXTURE_2D:
			renderTexture2D(testContext, renderContext, textureRenderer, results, rng, name, data, info, verify);
			break;

		case GL_TEXTURE_3D:
			renderTexture3D(testContext, renderContext, textureRenderer, results, rng, name, data, info, verify);
			break;

		case GL_TEXTURE_CUBE_MAP:
			renderTextureCubemap(testContext, renderContext, textureRenderer, results, rng, name, data, info, verify);
			break;

		case GL_TEXTURE_2D_ARRAY:
			renderTexture2DArray(testContext, renderContext, textureRenderer, results, rng, name, data, info, verify);
			break;

		case GL_RENDERBUFFER:
			renderRenderbuffer(testContext, renderContext, results, name, data, info, verify);
			break;

		default:
			DE_ASSERT(false);
	}
}